

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::EnableTracingResponse::ParseFromArray
          (EnableTracingResponse *this,void *raw,size_t size)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst;
  bool bVar18;
  uint *local_70;
  uint *local_60;
  Field local_58;
  uint *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  uint *local_38;
  
  dst = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar17 = (uint *)(size + (long)raw);
  do {
    lVar6 = 7;
    if (puVar17 <= raw) goto LAB_0026e49f;
    uVar10 = (ulong)(char)(byte)*raw;
    puVar16 = (uint *)((long)raw + 1);
    if ((long)uVar10 < 0) {
      bVar1 = (byte)*raw;
      uVar3 = (ulong)(bVar1 & 0x7f);
      bVar8 = false;
      puVar7 = puVar16;
      for (lVar5 = lVar6;
          (puVar14 = puVar7, uVar10 = uVar3, (char)bVar1 < '\0' &&
          (bVar18 = 0x38 < lVar5 - 7U, bVar8 = bVar18 || puVar17 <= puVar7, size = (size_t)puVar7,
          puVar14 = puVar16, uVar10 = 0, !bVar18 && puVar17 > puVar7)); lVar5 = lVar5 + 7) {
        bVar1 = (byte)*puVar7;
        puVar7 = (uint *)((long)puVar7 + 1);
        uVar3 = uVar3 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
        size = (size_t)puVar7;
      }
      puVar16 = puVar14;
      if (bVar8) {
        puVar16 = (uint *)raw;
        uVar10 = 0;
      }
      if (puVar16 == (uint *)raw) goto LAB_0026e49f;
    }
    uVar9 = (uint)(uVar10 >> 3);
    if ((uVar9 == 0) || (puVar17 <= puVar16)) {
switchD_0026e316_caseD_3:
      bVar8 = false;
      uVar10 = 0;
      local_58.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar10 & 7) {
      case 0:
        puVar11 = (uint *)0x0;
        bVar8 = puVar16 >= puVar17;
        if (puVar16 < puVar17) {
          size = (long)puVar16 + 1;
          puVar7 = (uint *)(ulong)((byte)*puVar16 & 0x7f);
          puVar14 = puVar7;
          uVar13 = 0;
          if ((char)(byte)*puVar16 < '\0') {
            puVar14 = (uint *)0x0;
            uVar13 = 0;
            lVar6 = 7;
            puVar15 = (uint *)size;
            do {
              bVar18 = 0x38 < lVar6 - 7U;
              bVar8 = bVar18 || puVar17 <= puVar15;
              if (bVar18 || puVar17 <= puVar15) goto LAB_0026e4a6;
              uVar2 = *puVar15;
              puVar15 = (uint *)((long)puVar15 + 1);
              puVar7 = (uint *)((ulong)puVar7 | (ulong)((byte)uVar2 & 0x7f) << ((byte)lVar6 & 0x3f))
              ;
              lVar6 = lVar6 + 7;
            } while ((char)(byte)uVar2 < '\0');
            puVar14 = (uint *)((ulong)puVar7 & 0xffffffff);
            size = (size_t)puVar15;
            uVar13 = (uint)((ulong)puVar7 >> 0x20);
          }
        }
        else {
          puVar14 = (uint *)0x0;
          uVar13 = 0;
        }
LAB_0026e4a6:
        puVar7 = (uint *)(ulong)uVar13;
        if (bVar8) {
          size = (size_t)puVar16;
          puVar7 = puVar11;
          puVar14 = puVar11;
        }
        local_70 = puVar16;
        local_48 = (uint *)raw;
        if ((uint *)size != puVar16) goto LAB_0026e4cd;
        uVar10 = 0;
        bVar8 = false;
        local_58.int_value_ = (uint64_t)puVar11;
        goto LAB_0026e50f;
      case 1:
        size = (size_t)(puVar16 + 2);
        if (puVar17 < size) {
LAB_0026e49f:
          uVar10 = 0;
          bVar8 = false;
          local_58.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_0026e50f;
        }
        puVar14 = *(uint **)puVar16;
        puVar7 = (uint *)((ulong)puVar14 >> 0x20);
        break;
      case 2:
        bVar8 = puVar16 >= puVar17;
        puVar7 = local_60;
        if (puVar16 < puVar17) {
          bVar1 = (byte)*puVar16;
          puVar11 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar14 = (uint *)((long)puVar16 + 1U);
          for (; (size = (size_t)puVar14, puVar7 = puVar11, (char)bVar1 < '\0' &&
                 (bVar18 = 0x38 < lVar6 - 7U, bVar8 = bVar18 || puVar17 <= puVar14,
                 size = (size_t)((long)puVar16 + 1U), puVar7 = local_60,
                 !bVar18 && puVar17 > puVar14)); lVar6 = lVar6 + 7) {
            bVar1 = (byte)*puVar14;
            puVar14 = (uint *)((long)puVar14 + 1);
            puVar11 = (uint *)((ulong)puVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f));
          }
        }
        local_60 = puVar7;
        if (bVar8) {
          size = (size_t)puVar16;
          local_60 = (uint *)0x0;
        }
        if (((uint *)size == puVar16) || ((uint *)((long)puVar17 - size) < local_60)) {
          puVar7 = (uint *)0x0;
          puVar14 = (uint *)0x0;
          bVar8 = false;
          puVar11 = (uint *)0x0;
        }
        else {
          puVar7 = (uint *)(size >> 0x20);
          puVar14 = (uint *)(size & 0xffffffff);
          size = size + (long)local_60;
          bVar8 = true;
          puVar11 = local_60;
        }
        local_70 = puVar16;
        if (!bVar8) goto LAB_0026e49f;
        goto LAB_0026e4cd;
      default:
        goto switchD_0026e316_caseD_3;
      case 5:
        size = (size_t)(puVar16 + 1);
        puVar7 = (uint *)0x0;
        if (puVar17 < size) goto LAB_0026e49f;
        puVar14 = (uint *)(ulong)*puVar16;
      }
      puVar11 = (uint *)0x0;
LAB_0026e4cd:
      bVar8 = true;
      raw = (void *)size;
      if ((uVar9 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
        local_58.int_value_ = (ulong)puVar14 & 0xffffffff | (long)puVar7 << 0x20;
        uVar10 = (ulong)puVar11 | (uVar10 >> 3) << 0x20 | (ulong)((uint)uVar10 & 7) << 0x30;
        bVar8 = false;
      }
      else {
        local_58.int_value_ = 0;
        uVar10 = 0;
      }
    }
LAB_0026e50f:
    puVar16 = &switchD_0026e316::switchdataD_0034f530;
    if (!bVar8) {
      local_58.size_ = (uint32_t)uVar10;
      local_58.type_ = (uint8_t)(uVar10 >> 0x30);
      local_58.id_ = (uint16_t)(uVar10 >> 0x20);
      if (local_58.id_ != 0) {
        local_40 = dst;
        do {
          uVar4 = (ushort)(uVar10 >> 0x20);
          if (uVar4 < 4) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar10 >> 0x20) & 0x3f);
          }
          if (uVar4 == 3) {
            protozero::Field::get(&local_58,&this->error_);
          }
          else if (((uint)(uVar10 >> 0x20) & 0xffff) == 1) {
            this->disabled_ = (uint *)local_58.int_value_ != (uint *)0x0;
          }
          else {
            protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,dst);
          }
          do {
            if (puVar17 <= raw) goto LAB_0026e6c8;
            uVar10 = (ulong)(char)(byte)*raw;
            puVar7 = (uint *)((long)raw + 1);
            if ((long)uVar10 < 0) {
              uVar3 = (ulong)((byte)*raw & 0x7f);
              bVar8 = false;
              uVar10 = uVar3;
              puVar14 = puVar7;
              if ((char)(byte)*raw < '\0') {
                lVar6 = 7;
                puVar11 = puVar7;
                do {
                  bVar8 = 0x38 < lVar6 - 7U || puVar17 <= puVar11;
                  uVar10 = 0;
                  puVar14 = puVar7;
                  if (bVar8) break;
                  uVar9 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar3 = uVar3 | (ulong)((byte)uVar9 & 0x7f) << ((byte)lVar6 & 0x3f);
                  lVar6 = lVar6 + 7;
                  uVar10 = uVar3;
                  puVar14 = puVar11;
                } while ((char)(byte)uVar9 < '\0');
              }
              puVar7 = puVar14;
              if (bVar8) {
                puVar7 = (uint *)raw;
                uVar10 = 0;
              }
              if (puVar7 == (uint *)raw) goto LAB_0026e6c8;
            }
            uVar9 = (uint)(uVar10 >> 3);
            if ((uVar9 == 0) || (puVar17 <= puVar7)) {
switchD_0026e75a_caseD_3:
              local_58.int_value_ = 0;
              bVar8 = false;
              uVar10 = 0;
              goto LAB_0026e99c;
            }
            switch((uint)uVar10 & 7) {
            case 0:
              local_58.int_value_ = 0;
              bVar8 = puVar7 >= puVar17;
              if (puVar7 < puVar17) {
                puVar14 = (uint *)((long)puVar7 + 1);
                uVar13 = (byte)*puVar7 & 0x7f;
                uVar3 = (ulong)uVar13;
                puVar11 = (uint *)(ulong)uVar13;
                puVar16 = puVar14;
                uVar13 = 0;
                if ((char)(byte)*puVar7 < '\0') {
                  puVar11 = (uint *)0x0;
                  lVar6 = 7;
                  puVar15 = puVar14;
                  do {
                    bVar18 = 0x38 < lVar6 - 7U;
                    bVar8 = bVar18 || puVar17 <= puVar15;
                    puVar16 = puVar14;
                    uVar13 = 0;
                    if (bVar18 || puVar17 <= puVar15) break;
                    bVar1 = (byte)*puVar15;
                    puVar15 = (uint *)((long)puVar15 + 1);
                    uVar3 = uVar3 | (ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f);
                    lVar6 = lVar6 + 7;
                    if (-1 < (char)bVar1) {
                      puVar11 = (uint *)(uVar3 & 0xffffffff);
                    }
                    puVar16 = puVar15;
                    uVar13 = (uint)(uVar3 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                puVar11 = (uint *)0x0;
                uVar13 = 0;
              }
              if (bVar8) {
                puVar11 = (uint *)local_58.int_value_;
              }
              puVar14 = (uint *)(ulong)uVar13;
              if (bVar8) {
                puVar16 = puVar7;
                puVar14 = (uint *)local_58.int_value_;
              }
              puVar15 = (uint *)local_58.int_value_;
              dst = local_40;
              local_48 = (uint *)raw;
              local_38 = puVar7;
              if (puVar16 == puVar7) {
                uVar10 = 0;
                bVar8 = false;
              }
              else {
LAB_0026e951:
                bVar8 = true;
                raw = puVar16;
                if ((uVar9 < 0x10000) && (puVar15 < (uint *)0x10000000)) {
                  local_58.int_value_ = (ulong)puVar11 & 0xffffffff | (long)puVar14 << 0x20;
                  uVar10 = (ulong)puVar15 | (uVar10 >> 3) << 0x20 | (uVar10 & 7) << 0x30;
                  bVar8 = false;
                }
                else {
                  local_58.int_value_ = 0;
                  uVar10 = 0;
                }
              }
              break;
            case 1:
              puVar16 = puVar7 + 2;
              if (puVar16 <= puVar17) {
                puVar11 = *(uint **)puVar7;
                puVar14 = (uint *)((ulong)puVar11 >> 0x20);
LAB_0026e7c5:
                puVar15 = (uint *)0x0;
                goto LAB_0026e951;
              }
              goto LAB_0026e6c8;
            case 2:
              bVar8 = puVar7 >= puVar17;
              puVar14 = local_70;
              if (puVar7 < puVar17) {
                puVar11 = (uint *)((long)puVar7 + 1);
                puVar15 = (uint *)(ulong)((byte)*puVar7 & 0x7f);
                puVar16 = puVar11;
                puVar14 = puVar15;
                if ((char)(byte)*puVar7 < '\0') {
                  lVar6 = 7;
                  puVar12 = puVar11;
                  do {
                    bVar8 = 0x38 < lVar6 - 7U || puVar17 <= puVar12;
                    puVar16 = puVar11;
                    puVar14 = local_70;
                    if (bVar8) break;
                    uVar13 = *puVar12;
                    puVar12 = (uint *)((long)puVar12 + 1);
                    puVar15 = (uint *)((ulong)puVar15 |
                                      (ulong)((byte)uVar13 & 0x7f) << ((byte)lVar6 & 0x3f));
                    lVar6 = lVar6 + 7;
                    puVar16 = puVar12;
                    puVar14 = puVar15;
                  } while ((char)(byte)uVar13 < '\0');
                }
              }
              local_70 = puVar14;
              puVar11 = (uint *)0x0;
              if (bVar8) {
                puVar16 = puVar7;
                local_70 = puVar11;
              }
              if (puVar16 == puVar7) {
                puVar14 = (uint *)0x0;
                bVar8 = false;
                puVar15 = (uint *)0x0;
              }
              else if ((uint *)((long)puVar17 - (long)puVar16) < local_70) {
                puVar11 = (uint *)0x0;
                puVar14 = (uint *)0x0;
                bVar8 = false;
                puVar15 = (uint *)0x0;
              }
              else {
                puVar14 = (uint *)((ulong)puVar16 >> 0x20);
                puVar11 = (uint *)((ulong)puVar16 & 0xffffffff);
                puVar16 = (uint *)((long)puVar16 + (long)local_70);
                bVar8 = true;
                puVar15 = local_70;
              }
              if (bVar8) goto LAB_0026e951;
              local_58.int_value_ = 0;
              uVar10 = 0;
              bVar8 = false;
              break;
            default:
              goto switchD_0026e75a_caseD_3;
            case 5:
              puVar16 = puVar7 + 1;
              puVar14 = (uint *)0x0;
              if (puVar16 <= puVar17) {
                puVar11 = (uint *)(ulong)*puVar7;
                goto LAB_0026e7c5;
              }
LAB_0026e6c8:
              local_58.int_value_ = 0;
              uVar10 = 0;
              bVar8 = false;
            }
LAB_0026e99c:
          } while (bVar8);
          local_58.size_ = (uint32_t)uVar10;
          local_58.type_ = (uint8_t)(uVar10 >> 0x30);
          local_58.id_ = (uint16_t)(uVar10 >> 0x20);
        } while (local_58.id_ != 0);
      }
      return puVar17 == (uint *)raw;
    }
  } while( true );
}

Assistant:

bool EnableTracingResponse::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* disabled */:
        field.get(&disabled_);
        break;
      case 3 /* error */:
        field.get(&error_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}